

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

int __thiscall HDual::util_getBasisInvRow(HDual *this,int r,double *coef,int *inds,int *ninds)

{
  reference pvVar1;
  reference pvVar2;
  HVector *in_RCX;
  long in_RDX;
  int in_ESI;
  HVector *in_RDI;
  undefined4 *in_R8;
  int ix;
  int row;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  HVector::clear(in_RCX);
  *(undefined4 *)
   ((long)&in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 1;
  iVar3 = in_ESI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  *pvVar1 = iVar3;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &in_RDI[2].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long)in_ESI);
  *pvVar2 = 1.0;
  *(undefined1 *)
   &in_RDI[2].iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 1;
  HFactor::btran((HFactor *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
                 (double)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
  for (iVar3 = 0; iVar3 < *(int *)((long)&in_RDI->next + 4); iVar3 = iVar3 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)iVar3);
    *(value_type *)(in_RDX + (long)iVar3 * 8) = *pvVar2;
  }
  if ((*(int *)((long)&in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4) < 0) ||
     (*(int *)((long)&in_RDI->next + 4) <
      *(int *)((long)&in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 4))) {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n",
           (ulong)*(uint *)((long)&in_RDI[1].packValue.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish + 4),
           (ulong)*(uint *)((long)&in_RDI->next + 4));
    *in_R8 = 0xffffffff;
  }
  else {
    for (iVar3 = 0;
        iVar3 < *(int *)((long)&in_RDI[1].packValue.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish + 4); iVar3 = iVar3 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
      (&in_RCX->size)[iVar3] = *pvVar1;
    }
    *in_R8 = *(undefined4 *)
              ((long)&in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 4);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int  HDual::util_getBasisInvRow(int r, double* coef, int* inds, int* ninds) {
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = r;
  row_ep.array[r] = 1;
  row_ep.packFlag = true;
  factor->btran(row_ep, row_epDensity);
  //  printf("util_getBasisInvRow: nnz = %4d/%4d\n", row_ep.count, numRow);
  for (int row=0; row<numRow; row++) {
    //    printf("BasisInvRow(%4d) = %11g\n", row,  row_ep.array[row]);
    coef[row] = row_ep.array[row];
  }
  if (0 <= row_ep.count && row_ep.count <= numRow) {
    for (int ix=0; ix<row_ep.count; ix++) inds[ix] = row_ep.index[ix];
    ninds[0] = row_ep.count;
  } else {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n", row_ep.count, numRow);
    ninds[0] = -1;
  }
  cout << flush;
  return 0;
}